

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.cpp
# Opt level: O0

void __thiscall ShrinkCmd::redo(ShrinkCmd *this)

{
  int iVar1;
  int rowEnd;
  PatternSelection *this_00;
  Track *track_00;
  int local_48;
  int track;
  undefined1 local_38 [8];
  Iterator iter;
  Editor ctx;
  ShrinkCmd *this_local;
  
  Module::edit((Module *)&iter.mEnd.super_PatternCursorBase.column);
  this_00 = PatternClip::selection(&(this->super_SelectionCmd).mClip);
  PatternSelection::iterator((Iterator *)local_38,this_00);
  local_48 = PatternSelection::Iterator::trackStart((Iterator *)local_38);
  while( true ) {
    iVar1 = PatternSelection::Iterator::trackEnd((Iterator *)local_38);
    if (iVar1 < local_48) break;
    track_00 = PatternModel::getTrack
                         ((this->super_SelectionCmd).mModel,
                          (uint)(this->super_SelectionCmd).mPattern,local_48);
    iVar1 = PatternSelection::Iterator::rowStart((Iterator *)local_38);
    rowEnd = PatternSelection::Iterator::rowEnd((Iterator *)local_38);
    commandsPatternTU::shrink(track_00,iVar1,rowEnd);
    local_48 = local_48 + 1;
  }
  Module::Editor::~Editor((Editor *)&iter.mEnd.super_PatternCursorBase.column);
  PatternModel::invalidate
            ((this->super_SelectionCmd).mModel,(uint)(this->super_SelectionCmd).mPattern,true);
  return;
}

Assistant:

void ShrinkCmd::redo() {
    {
        auto ctx = mModel.mModule.edit();
        auto const iter = mClip.selection().iterator();
        for (auto track = iter.trackStart(); track <= iter.trackEnd(); ++track) {
            TU::shrink(mModel.getTrack(mPattern, track), iter.rowStart(), iter.rowEnd());
        }
    }
    mModel.invalidate(mPattern, true);
}